

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueueExampleHugepages.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  thread t;
  SPSCQueue<int,_Allocator<int>_> q;
  thread local_1d0;
  long *local_1c8;
  SPSCQueue<int,_Allocator<int>_> local_1c0;
  
  rigtorp::SPSCQueue<int,_Allocator<int>_>::SPSCQueue(&local_1c0,2,(Allocator<int> *)&local_1c8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_1d0._M_id._M_thread = (id)0;
  local_1c8 = (long *)operator_new(0x10);
  *local_1c8 = (long)&PTR___State_00103d70;
  local_1c8[1] = (long)&local_1c0;
  std::thread::_M_start_thread(&local_1d0,&local_1c8,0);
  if (local_1c8 != (long *)0x0) {
    (**(code **)(*local_1c8 + 8))();
  }
  local_1c8 = (long *)CONCAT44(local_1c8._4_4_,1);
  rigtorp::SPSCQueue<int,_Allocator<int>_>::emplace<int>(&local_1c0,(int *)&local_1c8);
  std::thread::join();
  std::thread::~thread(&local_1d0);
  rigtorp::SPSCQueue<int,_Allocator<int>_>::~SPSCQueue(&local_1c0);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void)argc, (void)argv;

  using namespace rigtorp;

  SPSCQueue<int, Allocator<int>> q(2);
  std::cout << q.capacity() << std::endl;
  auto t = std::thread([&] {
    while (!q.front())
      ;
    std::cout << *q.front() << std::endl;
    q.pop();
  });
  q.push(1);
  t.join();

  return 0;
}